

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_url_tests.cpp
# Opt level: O0

void __thiscall
common_url_tests::decode_lowercase_hex_test::test_method(decode_lowercase_hex_test *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  const_string *msg;
  undefined1 *line_num;
  const_string *file;
  char *this_00;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  string_view in_stack_ffffffffffffffa0;
  const_string local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/common_url_tests.cpp"
    ;
    line_num = local_38;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (unsigned_long)in_stack_ffffffffffffff08);
    file = &local_48;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffff10,(char (*) [1])in_stack_ffffffffffffff08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (unsigned_long)in_stack_ffffffffffffff08);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    UrlDecode_abi_cxx11_(in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff18 = "\"\\xf0\\xa0\\xb0\"";
    in_stack_ffffffffffffff10 = anon_var_dwarf_39af93;
    in_stack_ffffffffffffff08 = "UrlDecode(\"%f0%a0%b0\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
              (local_68,local_78,0x41,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff08);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffff08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(decode_lowercase_hex_test) {
    BOOST_CHECK_EQUAL(UrlDecode("%f0%a0%b0"), "\xf0\xa0\xb0");
}